

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
linkedList<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
          (Earcut<unsigned_int> *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *points,
          bool clockwise)

{
  pointer paVar1;
  pointer paVar2;
  Node *pNVar3;
  float fVar4;
  Node *last;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  paVar1 = (points->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (points->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)paVar2 - (long)paVar1 >> 3;
  if (paVar2 == paVar1) {
    bVar6 = true;
  }
  else {
    lVar5 = lVar9 + -1;
    if (lVar9 == 0) {
      lVar5 = 0;
    }
    fVar4 = 0.0;
    lVar8 = 0;
    do {
      fVar4 = fVar4 + (paVar1[lVar5]._M_elems[1] + paVar1[lVar8]._M_elems[1]) *
                      (paVar1[lVar5]._M_elems[0] - paVar1[lVar8]._M_elems[0]);
      lVar7 = lVar8 + 1;
      lVar5 = lVar8;
      lVar8 = lVar7;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
    bVar6 = fVar4 <= 0.0;
  }
  if (bVar6 == clockwise) {
    if (paVar2 != paVar1) {
      last = (Node *)0x0;
      lVar5 = lVar9;
      lVar8 = lVar9 * 8;
      do {
        lVar5 = lVar5 + -1;
        last = insertNode<std::array<float,2ul>>
                         (this,this->vertices + lVar5,
                          (array<float,_2UL> *)
                          ((long)(points->
                                 super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[-1]._M_elems + lVar8),
                          last);
        lVar8 = lVar8 + -8;
      } while (lVar5 != 0);
      goto LAB_001496f1;
    }
  }
  else if (paVar2 != paVar1) {
    lVar8 = 0;
    lVar5 = 0;
    last = (Node *)0x0;
    do {
      last = insertNode<std::array<float,2ul>>
                       (this,this->vertices + lVar5,
                        (array<float,_2UL> *)
                        ((long)((points->
                                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8),last)
      ;
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar5);
    goto LAB_001496f1;
  }
  last = (Node *)0x0;
LAB_001496f1:
  if (last == (Node *)0x0) {
    last = (Node *)0x0;
  }
  else {
    pNVar3 = last->next;
    if ((last->x == pNVar3->x) && (!NAN(last->x) && !NAN(pNVar3->x))) {
      if ((last->y == pNVar3->y) && (!NAN(last->y) && !NAN(pNVar3->y))) {
        pNVar3->prev = last->prev;
        last->prev->next = pNVar3;
        pNVar3 = last->prevZ;
        if (pNVar3 != (Node *)0x0) {
          pNVar3->nextZ = last->nextZ;
        }
        if (last->nextZ != (Node *)0x0) {
          last->nextZ->prevZ = pNVar3;
        }
        last = last->next;
      }
    }
  }
  this->vertices = this->vertices + lVar9;
  return last;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}